

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Instr * __thiscall FlowGraph::RemoveInstr(FlowGraph *this,Instr *instr,GlobOpt *globOpt)

{
  OpCode OVar1;
  FlowGraph *pFVar2;
  Func *this_00;
  IRKind IVar3;
  bool bVar4;
  BOOL BVar5;
  GlobOptBlockData *this_01;
  Opnd *opnd;
  StackSym *pSVar6;
  ByteCodeUsesInstr *pBVar7;
  LabelInstr *pLVar8;
  bool local_61;
  Instr *local_58;
  Instr *instrLabel;
  ByteCodeUsesInstr *newByteCodeUseInstr;
  ByteCodeUsesInstr *byteCodeUsesInstr;
  OpCode opcode;
  Instr *instrPrev;
  GlobOpt *globOpt_local;
  Instr *instr_local;
  FlowGraph *this_local;
  
  pFVar2 = (FlowGraph *)instr->m_prev;
  if (globOpt == (GlobOpt *)0x0) {
    IR::Instr::Remove(instr);
    this_local = pFVar2;
  }
  else {
    IVar3 = IR::Instr::GetKind(instr);
    local_61 = true;
    if (IVar3 != InstrKindLabel) {
      local_61 = IR::Instr::IsProfiledLabelInstr(instr);
    }
    if (local_61 == false) {
      bVar4 = IR::Instr::IsByteCodeUsesInstr(instr);
      this_local = (FlowGraph *)instr;
      if (!bVar4) {
        OVar1 = instr->m_opcode;
        if ((OVar1 == LdElemI_A) && (bVar4 = IR::Instr::DoStackArgsOpt(instr), bVar4)) {
          this_01 = GlobOpt::CurrentBlockData(globOpt);
          opnd = IR::Instr::GetSrc1(instr);
          BVar5 = GlobOptBlockData::IsArgumentsOpnd(this_01,opnd);
          if ((BVar5 != 0) &&
             (pSVar6 = Func::GetScopeObjSym(instr->m_func), pSVar6 != (StackSym *)0x0)) {
            pBVar7 = IR::ByteCodeUsesInstr::New(instr);
            pSVar6 = Func::GetScopeObjSym(instr->m_func);
            IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar7,(pSVar6->super_Sym).m_id);
            IR::Instr::InsertAfter(instr,&pBVar7->super_Instr);
          }
        }
        pBVar7 = GlobOpt::ConvertToByteCodeUses(globOpt,instr);
        this_local = pFVar2;
        if ((pBVar7 != (ByteCodeUsesInstr *)0x0) &&
           (pBVar7->propertySymUse = (PropertySym *)0x0, this_local = (FlowGraph *)pBVar7,
           OVar1 == Yield)) {
          for (local_58 = (pBVar7->super_Instr).m_next; local_58->m_opcode != GeneratorBailInLabel;
              local_58 = local_58->m_next) {
          }
          this_00 = this->func;
          pLVar8 = IR::Instr::AsLabelInstr(local_58);
          Func::RemoveDeadYieldOffsetResumeLabel(this_00,pLVar8);
          pLVar8 = IR::Instr::AsLabelInstr(local_58);
          pLVar8->field_0x78 = pLVar8->field_0x78 & 0xfb;
        }
      }
    }
    else {
      pLVar8 = IR::Instr::AsLabelInstr(instr);
      pLVar8->field_0x78 = pLVar8->field_0x78 & 0xfe;
      this_local = (FlowGraph *)instr;
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
FlowGraph::RemoveInstr(IR::Instr *instr, GlobOpt * globOpt)
{
    IR::Instr *instrPrev = instr->m_prev;
    if (globOpt)
    {
        // Removing block during glob opt.  Need to maintain the graph so that
        // bailout will record the byte code use in case the dead code is exposed
        // by dyno-pogo optimization (where bailout need the byte code uses from
        // the dead blocks where it may not be dead after bailing out)
        if (instr->IsLabelInstr())
        {
            instr->AsLabelInstr()->m_isLoopTop = false;
            return instr;
        }
        else if (instr->IsByteCodeUsesInstr())
        {
            return instr;
        }

        /*
        *   Scope object has to be implicitly live whenever Heap Arguments object is live.
        *       - When we restore HeapArguments object in the bail out path, it expects the scope object also to be restored - if one was created.
        */
        Js::OpCode opcode = instr->m_opcode;
        if (opcode == Js::OpCode::LdElemI_A && instr->DoStackArgsOpt() &&
            globOpt->CurrentBlockData()->IsArgumentsOpnd(instr->GetSrc1()) && instr->m_func->GetScopeObjSym())
        {
            IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(instr);
            byteCodeUsesInstr->SetNonOpndSymbol(instr->m_func->GetScopeObjSym()->m_id);
            instr->InsertAfter(byteCodeUsesInstr);
        }

        IR::ByteCodeUsesInstr * newByteCodeUseInstr = globOpt->ConvertToByteCodeUses(instr);
        if (newByteCodeUseInstr != nullptr)
        {
            // We don't care about property used in these instruction
            // It is only necessary for field copy prop so that we will keep the implicit call
            // up to the copy prop location.
            newByteCodeUseInstr->propertySymUse = nullptr;

            if (opcode == Js::OpCode::Yield)
            {
                IR::Instr *instrLabel = newByteCodeUseInstr->m_next;
                while (instrLabel->m_opcode != Js::OpCode::GeneratorBailInLabel)
                {
                    instrLabel = instrLabel->m_next;
                }
                func->RemoveDeadYieldOffsetResumeLabel(instrLabel->AsLabelInstr());
                instrLabel->AsLabelInstr()->m_hasNonBranchRef = false;
            }

            // Save the last instruction to update the block with
            return newByteCodeUseInstr;
        }
        else
        {
            return instrPrev;
        }
    }
    else
    {
        instr->Remove();
        return instrPrev;
    }
}